

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRDetector.cpp
# Opt level: O3

DimensionEstimate *
ZXing::QRCode::EstimateDimension
          (DimensionEstimate *__return_storage_ptr__,BitMatrix *image,ConcentricPattern a,
          ConcentricPattern b)

{
  ConcentricPattern b_00;
  ConcentricPattern b_01;
  DimensionEstimate *pDVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double in_stack_ffffffffffffffc0;
  double in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  
  b_00.super_PointF.y = in_stack_ffffffffffffffc8;
  b_00.super_PointF.x = in_stack_ffffffffffffffc0;
  b_00._16_8_ = in_stack_ffffffffffffffd0;
  dVar7 = EstimateModuleSize(image,a,b_00);
  b_01.super_PointF.y = dVar7;
  b_01.super_PointF.x = in_stack_ffffffffffffffc0;
  b_01._16_8_ = a.super_PointF.y;
  dVar8 = EstimateModuleSize(image,b,b_01);
  pDVar1 = (DimensionEstimate *)0x0;
  dVar9 = 0.0;
  iVar4 = 4;
  if ((0.0 <= dVar7) && (0.0 <= dVar8)) {
    dVar9 = (dVar7 + dVar8) * 0.5;
    lVar2 = lround(SQRT((a.super_PointF.x - b.super_PointF.x) *
                        (a.super_PointF.x - b.super_PointF.x) +
                        (a.super_PointF.y - b.super_PointF.y) *
                        (a.super_PointF.y - b.super_PointF.y)) / dVar9);
    iVar4 = (int)lVar2;
    uVar3 = iVar4 + 7;
    uVar5 = iVar4 + 10;
    if (-1 < (int)uVar3) {
      uVar5 = uVar3;
    }
    iVar6 = (uVar5 & 0xfffffffc) - uVar3;
    pDVar1 = (DimensionEstimate *)(ulong)(iVar4 + iVar6 + 8);
    iVar6 = iVar6 + 1;
    iVar4 = -iVar6;
    if (0 < iVar6) {
      iVar4 = iVar6;
    }
  }
  __return_storage_ptr__->dim = (int)pDVar1;
  __return_storage_ptr__->ms = dVar9;
  __return_storage_ptr__->err = iVar4;
  return pDVar1;
}

Assistant:

static DimensionEstimate EstimateDimension(const BitMatrix& image, ConcentricPattern a, ConcentricPattern b)
{
	auto ms_a = EstimateModuleSize(image, a, b);
	auto ms_b = EstimateModuleSize(image, b, a);

	if (ms_a < 0 || ms_b < 0)
		return {};

	auto moduleSize = (ms_a + ms_b) / 2;

	int dimension = narrow_cast<int>(std::lround(distance(a, b) / moduleSize) + 7);
	int error     = 1 - (dimension % 4);

	return {dimension + error, moduleSize, std::abs(error)};
}